

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

char * cli_concat_args(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  size_t size;
  ulong uVar5;
  
  size = 1;
  if (1 < argc) {
    uVar5 = 1;
    do {
      sVar2 = strlen(argv[uVar5]);
      size = size + sVar2 + 1;
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  pcVar3 = (char *)xmalloc(size);
  if (argc < 2) {
    lVar4 = 0;
  }
  else {
    uVar5 = 1;
    lVar4 = 0;
    do {
      iVar1 = sprintf(pcVar3 + lVar4,"%s ",argv[uVar5]);
      lVar4 = lVar4 + iVar1;
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  pcVar3[lVar4 + -1] = '\0';
  return pcVar3;
}

Assistant:

char *cli_concat_args(int argc, const char *argv[])
{
	int i;
	size_t length = 1;
	for (i = 1; i < argc; i++) {
		length += strlen(argv[i]) + 1;
	}
	char *result = (char *)xmalloc(length);

	length = 0;
	for (i = 1; i < argc; i++) {
		length += sprintf(result + length, "%s ", argv[i]);
	}
	result[--length] = '\0';
	return result;
}